

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_test.cpp
# Opt level: O2

void __thiscall HuffmanTest::test_read_char(HuffmanTest *this,char ch)

{
  char cVar1;
  BitReader out;
  stringstream os;
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&os);
  BitReader::BitReader(&out,(istream *)&os);
  std::operator<<(local_188,ch);
  cVar1 = BitReader::read_char(&out);
  Test::check(cVar1 == ch,"test_read_char",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jeinygroove[P]Huffman-Archiver/test/huffman_test.cpp"
              ,0x3d);
  std::__cxx11::stringstream::~stringstream((stringstream *)&os);
  return;
}

Assistant:

void HuffmanTest::test_read_char(char ch) {
    std::stringstream os;
    BitReader out(os);
    os << ch;
    char res = out.read_char();
    DO_CHECK(res == ch);
}